

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O1

void Ssw_RarManSimulate(Ssw_RarMan_t *p,Vec_Int_t *vInit,int fUpdate,int fFirst)

{
  uint uVar1;
  Aig_Obj_t *pAVar2;
  word *pwVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  void **ppvVar7;
  Vec_Ptr_t *vCands;
  Aig_Man_t *pAVar8;
  uint uVar9;
  Vec_Ptr_t *pVVar10;
  Aig_Obj_t *pAVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  Aig_Obj_t *pAVar17;
  long lVar18;
  
  Ssw_RarManInitialize(p,vInit);
  p->vUpdConst->nSize = 0;
  p->vUpdClass->nSize = 0;
  Aig_ManIncrementTravId(p->pAig);
  if (fUpdate != 0) {
    pAVar8 = p->pAig;
    pVVar10 = pAVar8->vCis;
    if (0 < pVVar10->nSize) {
      lVar18 = 0;
      do {
        pAVar11 = (Aig_Obj_t *)pVVar10->pArray[lVar18];
        if (pAVar8->pReprs == (Aig_Obj_t **)0x0) {
          pAVar17 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar17 = pAVar8->pReprs[pAVar11->Id];
        }
        if (((pAVar17 != (Aig_Obj_t *)0x0) && (pAVar17->TravId != pAVar8->nTravIds)) &&
           (iVar5 = Ssw_RarManObjsAreEqual(p,pAVar11,pAVar17), iVar5 == 0)) {
          if (pAVar17 == p->pAig->pConst1) {
            pVVar10 = p->vUpdConst;
            uVar9 = pVVar10->nCap;
            if (pVVar10->nSize == uVar9) {
              if ((int)uVar9 < 0x10) {
                if (pVVar10->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc(0x80);
                }
                else {
                  ppvVar7 = (void **)realloc(pVVar10->pArray,0x80);
                }
                pVVar10->pArray = ppvVar7;
                iVar5 = 0x10;
              }
              else {
                iVar5 = uVar9 * 2;
                if (iVar5 <= (int)uVar9) goto LAB_006a501e;
                if (pVVar10->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc((ulong)uVar9 << 4);
                }
                else {
                  ppvVar7 = (void **)realloc(pVVar10->pArray,(ulong)uVar9 << 4);
                }
                pVVar10->pArray = ppvVar7;
              }
              pVVar10->nCap = iVar5;
            }
LAB_006a501e:
            iVar5 = pVVar10->nSize;
            pVVar10->nSize = iVar5 + 1;
            pVVar10->pArray[iVar5] = pAVar11;
          }
          else {
            pVVar10 = p->vUpdClass;
            uVar9 = pVVar10->nCap;
            if (pVVar10->nSize == uVar9) {
              if ((int)uVar9 < 0x10) {
                if (pVVar10->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc(0x80);
                }
                else {
                  ppvVar7 = (void **)realloc(pVVar10->pArray,0x80);
                }
                pVVar10->pArray = ppvVar7;
                iVar5 = 0x10;
              }
              else {
                iVar5 = uVar9 * 2;
                if (iVar5 <= (int)uVar9) goto LAB_006a4fe9;
                if (pVVar10->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc((ulong)uVar9 << 4);
                }
                else {
                  ppvVar7 = (void **)realloc(pVVar10->pArray,(ulong)uVar9 << 4);
                }
                pVVar10->pArray = ppvVar7;
              }
              pVVar10->nCap = iVar5;
            }
LAB_006a4fe9:
            iVar5 = pVVar10->nSize;
            pVVar10->nSize = iVar5 + 1;
            pVVar10->pArray[iVar5] = pAVar17;
            pAVar17->TravId = p->pAig->nTravIds;
          }
        }
        lVar18 = lVar18 + 1;
        pAVar8 = p->pAig;
        pVVar10 = pAVar8->vCis;
      } while (lVar18 < pVVar10->nSize);
    }
  }
  pAVar8 = p->pAig;
  pVVar10 = pAVar8->vObjs;
  uVar9 = pVVar10->nSize;
  uVar15 = (ulong)uVar9;
  if (0 < (int)uVar9) {
    lVar18 = 0;
    do {
      pAVar11 = (Aig_Obj_t *)pVVar10->pArray[lVar18];
      if ((pAVar11 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar11->field_0x18 & 7) - 7)) {
        iVar5 = pAVar11->Id;
        iVar6 = (int)uVar15;
        if (iVar6 <= iVar5) goto LAB_006a5503;
        pAVar17 = pAVar11->pFanin0;
        if (pAVar17 == (Aig_Obj_t *)0x0) {
          iVar13 = -1;
        }
        else {
          iVar13 = *(int *)(((ulong)pAVar17 & 0xfffffffffffffffe) + 0x24);
        }
        if (iVar6 <= iVar13) goto LAB_006a5503;
        pAVar2 = pAVar11->pFanin1;
        if (pAVar2 == (Aig_Obj_t *)0x0) {
          iVar14 = -1;
        }
        else {
          iVar14 = *(int *)(((ulong)pAVar2 & 0xfffffffffffffffe) + 0x24);
        }
        if (iVar6 <= iVar14) goto LAB_006a5503;
        uVar9 = p->pPars->nWords;
        if (0 < (int)uVar9) {
          pwVar3 = p->pObjData;
          uVar15 = 0;
          do {
            pwVar3[(long)(int)(iVar5 * uVar9) + uVar15] =
                 (pwVar3[(long)(int)(iVar14 * uVar9) + uVar15] ^ -(ulong)((uint)pAVar2 & 1)) &
                 (pwVar3[(long)(int)(iVar13 * uVar9) + uVar15] ^ -(ulong)((uint)pAVar17 & 1));
            uVar15 = uVar15 + 1;
          } while (uVar9 != uVar15);
        }
        if (fUpdate != 0) {
          if (pAVar8->pReprs == (Aig_Obj_t **)0x0) {
            pAVar17 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar17 = pAVar8->pReprs[iVar5];
          }
          if (((pAVar17 != (Aig_Obj_t *)0x0) && (pAVar17->TravId != pAVar8->nTravIds)) &&
             (iVar5 = Ssw_RarManObjsAreEqual(p,pAVar11,pAVar17), iVar5 == 0)) {
            if (pAVar17 == p->pAig->pConst1) {
              pVVar10 = p->vUpdConst;
              uVar9 = pVVar10->nCap;
              if (pVVar10->nSize == uVar9) {
                if ((int)uVar9 < 0x10) {
                  if (pVVar10->pArray == (void **)0x0) {
                    ppvVar7 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar7 = (void **)realloc(pVVar10->pArray,0x80);
                  }
                  pVVar10->pArray = ppvVar7;
                  iVar5 = 0x10;
                }
                else {
                  iVar5 = uVar9 * 2;
                  if (iVar5 <= (int)uVar9) goto LAB_006a529f;
                  if (pVVar10->pArray == (void **)0x0) {
                    ppvVar7 = (void **)malloc((ulong)uVar9 << 4);
                  }
                  else {
                    ppvVar7 = (void **)realloc(pVVar10->pArray,(ulong)uVar9 << 4);
                  }
                  pVVar10->pArray = ppvVar7;
                }
                pVVar10->nCap = iVar5;
              }
LAB_006a529f:
              iVar5 = pVVar10->nSize;
              pVVar10->nSize = iVar5 + 1;
              pVVar10->pArray[iVar5] = pAVar11;
            }
            else {
              pVVar10 = p->vUpdClass;
              uVar9 = pVVar10->nCap;
              if (pVVar10->nSize == uVar9) {
                if ((int)uVar9 < 0x10) {
                  if (pVVar10->pArray == (void **)0x0) {
                    ppvVar7 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar7 = (void **)realloc(pVVar10->pArray,0x80);
                  }
                  pVVar10->pArray = ppvVar7;
                  iVar5 = 0x10;
                }
                else {
                  iVar5 = uVar9 * 2;
                  if (iVar5 <= (int)uVar9) goto LAB_006a526a;
                  if (pVVar10->pArray == (void **)0x0) {
                    ppvVar7 = (void **)malloc((ulong)uVar9 << 4);
                  }
                  else {
                    ppvVar7 = (void **)realloc(pVVar10->pArray,(ulong)uVar9 << 4);
                  }
                  pVVar10->pArray = ppvVar7;
                }
                pVVar10->nCap = iVar5;
              }
LAB_006a526a:
              iVar5 = pVVar10->nSize;
              pVVar10->nSize = iVar5 + 1;
              pVVar10->pArray[iVar5] = pAVar17;
              pAVar17->TravId = p->pAig->nTravIds;
            }
          }
        }
      }
      lVar18 = lVar18 + 1;
      pAVar8 = p->pAig;
      pVVar10 = pAVar8->vObjs;
      uVar9 = pVVar10->nSize;
      uVar15 = (ulong)(int)uVar9;
    } while (lVar18 < (long)uVar15);
  }
  lVar18 = (long)pAVar8->vCos->nSize;
  if (0 < lVar18) {
    ppvVar7 = pAVar8->vCos->pArray;
    lVar12 = 0;
    do {
      pvVar4 = ppvVar7[lVar12];
      iVar5 = *(int *)((long)pvVar4 + 0x24);
      if ((int)uVar9 <= iVar5) {
LAB_006a5503:
        __assert_fail("Id < Aig_ManObjNumMax(p->pAig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswRarity.c"
                      ,0x53,"word *Ssw_RarObjSim(Ssw_RarMan_t *, int)");
      }
      uVar15 = *(ulong *)((long)pvVar4 + 8);
      if (uVar15 == 0) {
        iVar6 = -1;
      }
      else {
        iVar6 = *(int *)((uVar15 & 0xfffffffffffffffe) + 0x24);
      }
      if ((int)uVar9 <= iVar6) goto LAB_006a5503;
      uVar1 = p->pPars->nWords;
      if (0 < (int)uVar1) {
        pwVar3 = p->pObjData;
        uVar16 = 0;
        do {
          pwVar3[(long)(int)(iVar5 * uVar1) + uVar16] =
               pwVar3[(long)(int)(iVar6 * uVar1) + uVar16] ^ -(ulong)((uint)uVar15 & 1);
          uVar16 = uVar16 + 1;
        } while (uVar1 != uVar16);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != lVar18);
  }
  if (fUpdate == 0) {
    return;
  }
  if (fFirst == 0) {
    Ssw_ClassesRefineConst1Group(p->ppClasses,p->vUpdConst,1);
    Ssw_ClassesRefineGroup(p->ppClasses,p->vUpdClass,1);
    return;
  }
  vCands = (Vec_Ptr_t *)malloc(0x10);
  vCands->nCap = 1000;
  vCands->nSize = 0;
  ppvVar7 = (void **)malloc(8000);
  vCands->pArray = ppvVar7;
  pAVar8 = p->pAig;
  pVVar10 = pAVar8->vObjs;
  if (0 < pVVar10->nSize) {
    lVar18 = 0;
    do {
      pvVar4 = pVVar10->pArray[lVar18];
      if (pvVar4 != (void *)0x0) {
        if (pAVar8->pReprs == (Aig_Obj_t **)0x0) {
          pAVar11 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar11 = pAVar8->pReprs[*(int *)((long)pvVar4 + 0x24)];
        }
        if (pAVar11 == pAVar8->pConst1) {
          uVar9 = vCands->nCap;
          if (vCands->nSize == uVar9) {
            if ((int)uVar9 < 0x10) {
              if (vCands->pArray == (void **)0x0) {
                ppvVar7 = (void **)malloc(0x80);
              }
              else {
                ppvVar7 = (void **)realloc(vCands->pArray,0x80);
              }
              iVar5 = 0x10;
            }
            else {
              iVar5 = uVar9 * 2;
              if (iVar5 <= (int)uVar9) goto LAB_006a543c;
              if (vCands->pArray == (void **)0x0) {
                ppvVar7 = (void **)malloc((ulong)uVar9 << 4);
              }
              else {
                ppvVar7 = (void **)realloc(vCands->pArray,(ulong)uVar9 << 4);
              }
            }
            vCands->pArray = ppvVar7;
            vCands->nCap = iVar5;
          }
LAB_006a543c:
          iVar5 = vCands->nSize;
          vCands->nSize = iVar5 + 1;
          vCands->pArray[iVar5] = pvVar4;
        }
      }
      lVar18 = lVar18 + 1;
      pAVar8 = p->pAig;
      pVVar10 = pAVar8->vObjs;
    } while (lVar18 < pVVar10->nSize);
  }
  iVar5 = vCands->nSize;
  iVar6 = Ssw_ClassesCand1Num(p->ppClasses);
  if (iVar5 != iVar6) {
    __assert_fail("Vec_PtrSize(vCands) == Ssw_ClassesCand1Num(p->ppClasses)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswRarity.c"
                  ,0x2d7,"void Ssw_RarManSimulate(Ssw_RarMan_t *, Vec_Int_t *, int, int)");
  }
  Ssw_ClassesPrepareRehash(p->ppClasses,vCands,0);
  if (vCands->pArray != (void **)0x0) {
    free(vCands->pArray);
    vCands->pArray = (void **)0x0;
  }
  free(vCands);
  return;
}

Assistant:

void Ssw_RarManSimulate( Ssw_RarMan_t * p, Vec_Int_t * vInit, int fUpdate, int fFirst )
{
    Aig_Obj_t * pObj, * pRepr;
    word * pSim, * pSim0, * pSim1;
    word Flip, Flip0, Flip1;
    int w, i;
    // initialize
    Ssw_RarManInitialize( p, vInit );
    Vec_PtrClear( p->vUpdConst );
    Vec_PtrClear( p->vUpdClass );
    Aig_ManIncrementTravId( p->pAig );
    // check comb inputs
    if ( fUpdate )
    Aig_ManForEachCi( p->pAig, pObj, i )
    {
        pRepr = Aig_ObjRepr(p->pAig, pObj);
        if ( pRepr == NULL || Aig_ObjIsTravIdCurrent( p->pAig, pRepr ) )
            continue;
        if ( Ssw_RarManObjsAreEqual( p, pObj, pRepr ) )
            continue;
        // save for update
        if ( pRepr == Aig_ManConst1(p->pAig) )
            Vec_PtrPush( p->vUpdConst, pObj );
        else
        {
            Vec_PtrPush( p->vUpdClass, pRepr );
            Aig_ObjSetTravIdCurrent( p->pAig, pRepr );
        }
    }
    // simulate
    Aig_ManForEachNode( p->pAig, pObj, i )
    {
        pSim  = Ssw_RarObjSim( p, Aig_ObjId(pObj) );
        pSim0 = Ssw_RarObjSim( p, Aig_ObjFaninId0(pObj) );
        pSim1 = Ssw_RarObjSim( p, Aig_ObjFaninId1(pObj) );
        Flip0 = Aig_ObjFaninC0(pObj) ? ~(word)0 : 0;
        Flip1 = Aig_ObjFaninC1(pObj) ? ~(word)0 : 0;
        for ( w = 0; w < p->pPars->nWords; w++ )
            pSim[w] = (Flip0 ^ pSim0[w]) & (Flip1 ^ pSim1[w]);


        if ( !fUpdate )
            continue;
        // check classes
        pRepr = Aig_ObjRepr(p->pAig, pObj);
        if ( pRepr == NULL || Aig_ObjIsTravIdCurrent( p->pAig, pRepr ) )
            continue;
        if ( Ssw_RarManObjsAreEqual( p, pObj, pRepr ) )
            continue;
        // save for update
        if ( pRepr == Aig_ManConst1(p->pAig) )
            Vec_PtrPush( p->vUpdConst, pObj );
        else
        {
            Vec_PtrPush( p->vUpdClass, pRepr );
            Aig_ObjSetTravIdCurrent( p->pAig, pRepr );
        }
    }
    // transfer to POs
    Aig_ManForEachCo( p->pAig, pObj, i )
    {
        pSim  = Ssw_RarObjSim( p, Aig_ObjId(pObj) );
        pSim0 = Ssw_RarObjSim( p, Aig_ObjFaninId0(pObj) );
        Flip  = Aig_ObjFaninC0(pObj) ? ~(word)0 : 0;
        for ( w = 0; w < p->pPars->nWords; w++ )
            pSim[w] = Flip ^ pSim0[w];
    }
    // refine classes
    if ( fUpdate )
    {
        if ( fFirst )
        {
            Vec_Ptr_t * vCands = Vec_PtrAlloc( 1000 );
            Aig_ManForEachObj( p->pAig, pObj, i )
                if ( Ssw_ObjIsConst1Cand( p->pAig, pObj ) )
                    Vec_PtrPush( vCands, pObj );
            assert( Vec_PtrSize(vCands) == Ssw_ClassesCand1Num(p->ppClasses) );
            Ssw_ClassesPrepareRehash( p->ppClasses, vCands, 0 );
            Vec_PtrFree( vCands );
        }
        else
        {
            Ssw_ClassesRefineConst1Group( p->ppClasses, p->vUpdConst, 1 );
            Ssw_ClassesRefineGroup( p->ppClasses, p->vUpdClass, 1 );
        }
    }
}